

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O3

int do_arbsvn(int argc,char **argv)

{
  char *arg;
  _Bool _Var1;
  int iVar2;
  code *func_ptr;
  int argc_1;
  char **argv_1;
  
  if (argc < 1) {
    if (quiet == '\0') {
      do_arbsvn_cold_1();
    }
    return -1;
  }
  arg = *argv;
  _Var1 = arg_is_token(arg,"commit");
  if (_Var1) {
    func_ptr = arbsvn_commit;
  }
  else {
    _Var1 = arg_is_token(arg,"get-min-allowed-svn");
    if (!_Var1) {
      if (quiet != '\0') {
        return -1;
      }
      fprintf(_stderr,"Error: Wrong argument %s\n",arg);
      return -1;
    }
    func_ptr = arbsvn_get_min_allowed_svn;
  }
  iVar2 = do_no_special_args_func(argc + -1,argv + 1,func_ptr);
  return iVar2;
}

Assistant:

static int do_arbsvn(int argc, char *argv[])
{
    const char *sub_command = NULL;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    sub_command = argv[0];

    arg_next(&argc, &argv);

    if (arg_is_token(sub_command, "commit"))
    {
        return do_arbsvn_commit(argc, argv);
    }

    if (arg_is_token(sub_command, "get-min-allowed-svn"))
    {
        return do_arbsvn_get_min_allowed_svn(argc, argv);
    }

    fwupd_error("Wrong argument %s\n", sub_command);
    return ERROR_BAD_ARGUMENT;
}